

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

void __thiscall LinearSystem::LinearSystem(LinearSystem *this,Matrix *a,Matrix *b,Mode mode)

{
  Matrix local_e0;
  Matrix local_c0;
  ExtendedMatrix local_a0;
  
  Matrix::Matrix(&local_c0,a);
  Matrix::Matrix(&local_e0,b);
  ExtendedMatrix::ExtendedMatrix(&local_a0,&local_c0,&local_e0);
  LinearSystem(this,&local_a0,mode);
  ExtendedMatrix::~ExtendedMatrix(&local_a0);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_e0.elements_);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_c0.elements_);
  return;
}

Assistant:

LinearSystem::LinearSystem(const Matrix& a, const Matrix& b, Mode mode)
    : LinearSystem(ExtendedMatrix(a, b), mode) {}